

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::reallocateTo
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,size_type newCapacity)

{
  pointer p;
  size_type sVar1;
  pointer pEVar2;
  long lVar3;
  
  pEVar2 = (pointer)operator_new(newCapacity * 8);
  p = this->data_;
  sVar1 = this->len;
  if (sVar1 != 0) {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)&pEVar2->value + lVar3) = *(undefined8 *)((long)&p->value + lVar3);
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->cap = newCapacity;
  this->data_ = pEVar2;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }